

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O2

void __thiscall
SuiteSessionTests::
initiatorFixtureResendRequest_FIXTPreservedFieldOrder_UnsupportedMessageTypeHelper::
~initiatorFixtureResendRequest_FIXTPreservedFieldOrder_UnsupportedMessageTypeHelper
          (initiatorFixtureResendRequest_FIXTPreservedFieldOrder_UnsupportedMessageTypeHelper *this)

{
  ~initiatorFixtureResendRequest_FIXTPreservedFieldOrder_UnsupportedMessageTypeHelper
            ((initiatorFixtureResendRequest_FIXTPreservedFieldOrder_UnsupportedMessageTypeHelper *)
             &this[-1].m_details);
  return;
}

Assistant:

TEST_FIXTURE(initiatorFixture, ResendRequest_FIXTPreservedFieldOrder_UnsupportedMessageType) {
  startTimeStamp = UtcTimeStamp(8, 8, 8, 13, 5, 2015);
  endTimeStamp = UtcTimeStamp(16, 16, 16, 13, 5, 2200);
  startTime = UtcTimeOnly( startTimeStamp );
  endTime = UtcTimeOnly( endTimeStamp );

  SessionID sessionID( BeginString( "FIXT.1.1" ), SenderCompID( "TW" ), TargetCompID( "ISLD" ) );

  TimeRange sessionTime( startTime, endTime, 0, 31);

  DataDictionaryProvider provider;
  provider.addTransportDataDictionary( sessionID.getBeginString(), "../spec/FIXT11.xml" );
  DataDictionary dictionary = provider.getSessionDataDictionary(sessionID.getBeginString());
  dictionary.preserveMessageFieldsOrder(true);

  std::shared_ptr<DataDictionary> pDataDictionary = std::make_shared<DataDictionary>(dictionary);
  pDataDictionary->addHeaderField(98, false);
  pDataDictionary->addTrailerField(98, false);
  pDataDictionary->addMsgField(FIX::MsgType_Logon, 98);
  pDataDictionary->addMsgField(FIX::MsgType_ResendRequest, 98);
  pDataDictionary->addMsgField(FIX::MsgType_BusinessMessageReject, 98);

  provider.addTransportDataDictionary( sessionID.getBeginString(), pDataDictionary );
  provider.addApplicationDataDictionary(ApplVerID("20"), pDataDictionary);

  object = new Session( *this, factory, sessionID, provider,
      sessionTime, 1, 0 );
  object->setSenderDefaultApplVerID(ApplVerID("20"));
  object->setTargetDefaultApplVerID(ApplVerID("20"));


  FIX::Message sentLogon = createT11Logon( "TW", "ISLD", 1 );
  object->send(sentLogon);
  object->next();
  object->logon();

  FIX::Message receivedLogon = createT11Logon( "ISLD", "TW", 1 );
  object->next(receivedLogon, UtcTimeStamp());

  FIX::Message er = createT1142ExecutionReport( "ISLD", "TW", 2);
  object->next(er, UtcTimeStamp());

  CHECK_EQUAL(4, object->getExpectedSenderNum());
  CHECK_EQUAL(3, object->getExpectedTargetNum());
}